

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O3

RelationshipProperty * __thiscall
tinyusdz::RelationshipProperty::operator=(RelationshipProperty *this,RelationshipProperty *param_1)

{
  pointer pPVar1;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> local_28;
  
  this->_authored = param_1->_authored;
  (this->_relationship).type = (param_1->_relationship).type;
  Path::operator=(&(this->_relationship).targetPath,&(param_1->_relationship).targetPath);
  local_28.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (this->_relationship).targetPathVector.
       super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  pPVar1 = (param_1->_relationship).targetPathVector.
           super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_28.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_start =
       (this->_relationship).targetPathVector.
       super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_28.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (this->_relationship).targetPathVector.
       super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->_relationship).targetPathVector.
  super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_start =
       (param_1->_relationship).targetPathVector.
       super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->_relationship).targetPathVector.
  super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_finish = pPVar1;
  (this->_relationship).targetPathVector.
  super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (param_1->_relationship).targetPathVector.
       super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (param_1->_relationship).targetPathVector.
  super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->_relationship).targetPathVector.
  super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (param_1->_relationship).targetPathVector.
  super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector(&local_28);
  (this->_relationship).listOpQual = (param_1->_relationship).listOpQual;
  AttrMetas::operator=(&(this->_relationship)._metas,&(param_1->_relationship)._metas);
  (this->_relationship)._varying_authored = (param_1->_relationship)._varying_authored;
  return this;
}

Assistant:

RelationshipProperty() = default;